

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DTDScanner::scanTextDecl(DTDScanner *this)

{
  XMLCh XVar1;
  XMLBufferMgr *this_00;
  XMLCh *pXVar2;
  XMLBufferMgr *this_01;
  ReaderMgr *pRVar3;
  DocTypeHandler *pDVar4;
  XMLReader *this_02;
  bool bVar5;
  XMLCh XVar6;
  XMLBuffer *toFill;
  XMLCh *pXVar7;
  XMLBuffer *toFill_00;
  XMLSize_t XVar8;
  XMLCh *pXVar9;
  XMLScanner *pXVar10;
  XMLBufBid bbEncoding;
  XMLBufBid bbVersion;
  
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  this_00 = this->fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_00);
  bVar5 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"version");
  if (!bVar5) goto LAB_0030057a;
  bVar5 = scanEq(this);
  if (!bVar5) {
    XMLScanner::emitError(this->fScanner,ExpectedEqSign);
    pRVar3 = this->fReaderMgr;
    do {
      XVar6 = ReaderMgr::getNextChar(pRVar3);
      if (XVar6 == L'\0') break;
    } while (XVar6 != L'>');
    goto LAB_003007ab;
  }
  bVar5 = getQuotedString(this,toFill);
  if (!bVar5) {
    XMLScanner::emitError(this->fScanner,BadXMLVersion);
    pRVar3 = this->fReaderMgr;
    do {
      XVar6 = ReaderMgr::getNextChar(pRVar3);
      if (XVar6 == L'\0') break;
    } while (XVar6 != L'>');
    goto LAB_003007ab;
  }
  pXVar2 = toFill->fBuffer;
  pXVar2[toFill->fIndex] = L'\0';
  if (pXVar2 == L"1.1") {
LAB_0030054f:
    pXVar10 = this->fScanner;
    if (pXVar10->fXMLVersion != XMLV1_1) goto LAB_00300568;
  }
  else {
    pXVar7 = L"1.1";
    pXVar9 = pXVar2;
    if (pXVar2 == (XMLCh *)0x0) {
LAB_00300517:
      if (*pXVar7 == L'\0') goto LAB_0030054f;
    }
    else {
      do {
        XVar6 = *pXVar9;
        if (XVar6 == L'\0') goto LAB_00300517;
        XVar1 = *pXVar7;
        pXVar7 = pXVar7 + 1;
        pXVar9 = pXVar9 + 1;
      } while (XVar6 == XVar1);
    }
    if (pXVar2 != L"1.0") {
      pXVar7 = L"1.0";
      pXVar9 = pXVar2;
      if (pXVar2 == (XMLCh *)0x0) {
LAB_0030055e:
        if (*pXVar7 == L'\0') goto LAB_0030057a;
      }
      else {
        do {
          XVar6 = *pXVar9;
          if (XVar6 == L'\0') goto LAB_0030055e;
          XVar1 = *pXVar7;
          pXVar7 = pXVar7 + 1;
          pXVar9 = pXVar9 + 1;
        } while (XVar6 == XVar1);
      }
      pXVar10 = this->fScanner;
LAB_00300568:
      XMLScanner::emitError
                (pXVar10,UnsupportedXMLVersion,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
  }
LAB_0030057a:
  this_01 = this->fBufMgr;
  toFill_00 = XMLBufferMgr::bidOnBuffer(this_01);
  ReaderMgr::skipPastSpaces(this->fReaderMgr);
  bVar5 = XMLReader::skippedString(this->fReaderMgr->fCurReader,L"encoding");
  if (bVar5) {
    bVar5 = scanEq(this);
    if (bVar5) {
      getQuotedString(this,toFill_00);
      if (toFill_00->fIndex == 0) {
        XVar8 = 0;
      }
      else {
        pXVar2 = toFill_00->fBuffer;
        pXVar2[toFill_00->fIndex] = L'\0';
        bVar5 = XMLString::isValidEncName(pXVar2);
        if (bVar5) {
          ReaderMgr::skipPastSpaces(this->fReaderMgr);
          bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'?');
          if (bVar5) {
            bVar5 = ReaderMgr::skippedChar(this->fReaderMgr,L'>');
            if (!bVar5) {
              XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
              pRVar3 = this->fReaderMgr;
              do {
                XVar6 = ReaderMgr::getNextChar(pRVar3);
                if (XVar6 == L'>') break;
              } while (XVar6 != L'\0');
            }
          }
          else {
            XMLScanner::emitError(this->fScanner,UnterminatedXMLDecl);
            pRVar3 = this->fReaderMgr;
            do {
              XVar6 = ReaderMgr::getNextChar(pRVar3);
              if (XVar6 == L'\0') break;
            } while (XVar6 != L'>');
          }
          pDVar4 = this->fDocTypeHandler;
          if (pDVar4 != (DocTypeHandler *)0x0) {
            toFill->fBuffer[toFill->fIndex] = L'\0';
            toFill_00->fBuffer[toFill_00->fIndex] = L'\0';
            (*pDVar4->_vptr_DocTypeHandler[0x11])();
          }
          if (toFill_00->fIndex != 0) {
            this_02 = this->fReaderMgr->fCurReader;
            pXVar2 = toFill_00->fBuffer;
            pXVar2[toFill_00->fIndex] = L'\0';
            bVar5 = XMLReader::setEncoding(this_02,pXVar2);
            if (!bVar5) {
              pXVar10 = this->fScanner;
              pXVar2 = toFill_00->fBuffer;
              pXVar2[toFill_00->fIndex] = L'\0';
              XMLScanner::emitError
                        (pXVar10,ContradictoryEncoding,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
                        );
            }
          }
          goto LAB_003007a0;
        }
        XVar8 = toFill_00->fIndex;
      }
      pXVar10 = this->fScanner;
      pXVar2 = toFill_00->fBuffer;
      pXVar2[XVar8] = L'\0';
      XMLScanner::emitError(pXVar10,BadXMLEncoding,pXVar2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      pRVar3 = this->fReaderMgr;
      do {
        XVar6 = ReaderMgr::getNextChar(pRVar3);
        if (XVar6 == L'\0') break;
      } while (XVar6 != L'>');
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedEqSign);
      pRVar3 = this->fReaderMgr;
      do {
        XVar6 = ReaderMgr::getNextChar(pRVar3);
        if (XVar6 == L'\0') break;
      } while (XVar6 != L'>');
    }
  }
  else {
    XMLScanner::emitError(this->fScanner,EncodingRequired);
    pRVar3 = this->fReaderMgr;
    do {
      XVar6 = ReaderMgr::getNextChar(pRVar3);
      if (XVar6 == L'\0') break;
    } while (XVar6 != L'>');
  }
LAB_003007a0:
  XMLBufferMgr::releaseBuffer(this_01,toFill_00);
LAB_003007ab:
  XMLBufferMgr::releaseBuffer(this_00,toFill);
  return;
}

Assistant:

void DTDScanner::scanTextDecl()
{
    // Skip any subsequent whitespace before the version string
    fReaderMgr->skipPastSpaces();

    // Next should be the version string
    XMLBufBid bbVersion(fBufMgr);
    if (fReaderMgr->skippedString(XMLUni::fgVersionString))
    {
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        //
        //  Followed by a single or double quoted version. Get a buffer for
        //  the string.
        //
        if (!getQuotedString(bbVersion.getBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLVersion);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // If its not our supported version, issue an error but continue
        if (XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_1)) {
            if (fScanner->getXMLVersion() != XMLReader::XMLV1_1)
        	    fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
        }
        else if (!XMLString::equals(bbVersion.getRawBuffer(), XMLUni::fgVersion1_0))
            fScanner->emitError(XMLErrs::UnsupportedXMLVersion, bbVersion.getRawBuffer());
    }

    // Ok, now we must have an encoding string
    XMLBufBid bbEncoding(fBufMgr);
    fReaderMgr->skipPastSpaces();
    bool gotEncoding = false;
    if (fReaderMgr->skippedString(XMLUni::fgEncodingString))
    {
        // There must be a equal sign next
        if (!scanEq())
        {
            fScanner->emitError(XMLErrs::ExpectedEqSign);
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Followed by a single or double quoted version string
        getQuotedString(bbEncoding.getBuffer());
        if (bbEncoding.isEmpty() || !XMLString::isValidEncName(bbEncoding.getRawBuffer()))
        {
            fScanner->emitError(XMLErrs::BadXMLEncoding, bbEncoding.getRawBuffer());
            fReaderMgr->skipPastChar(chCloseAngle);
            return;
        }

        // Indicate that we got an encoding
        gotEncoding = true;
    }

    //
    // Encoding declarations are required in the external entity
    // if there is a text declaration present
    //
    if (!gotEncoding)
    {
      fScanner->emitError(XMLErrs::EncodingRequired);
      fReaderMgr->skipPastChar(chCloseAngle);
      return;

    }

    fReaderMgr->skipPastSpaces();
    if (!fReaderMgr->skippedChar(chQuestion))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }
     else if (!fReaderMgr->skippedChar(chCloseAngle))
    {
        fScanner->emitError(XMLErrs::UnterminatedXMLDecl);
        fReaderMgr->skipPastChar(chCloseAngle);
    }

    //
    //  If we have a document type handler and advanced callbacks are on,
    //  then call the TextDecl callback
    //
    if (fDocTypeHandler)
    {
        fDocTypeHandler->TextDecl
        (
            bbVersion.getRawBuffer()
            , bbEncoding.getRawBuffer()
        );
    }

    //
    //  If we got an encoding string, then we have to call back on the reader
    //  to tell it what the encoding is.
    //
    if (!bbEncoding.isEmpty())
    {
        if (!fReaderMgr->getCurrentReader()->setEncoding(bbEncoding.getRawBuffer()))
            fScanner->emitError(XMLErrs::ContradictoryEncoding, bbEncoding.getRawBuffer());
    }
}